

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O1

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  ulong *puVar9;
  long lVar10;
  string text;
  size_type lit_start;
  size_type link_start;
  size_type role_start;
  string line;
  char *local_e0;
  long local_d8;
  char local_d0;
  undefined7 uStack_cf;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  string local_68;
  RegularExpression *local_48;
  RegularExpression *local_40;
  RegularExpression *local_38;
  
  if (this->OutputLinePending == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->OS,"\n",1);
    this->OutputLinePending = false;
  }
  if (!inlineMarkup) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->OS,(line_in->_M_dataplus)._M_p,line_in->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    return;
  }
  ReplaceSubstitutions(&local_68,this,line_in);
  local_38 = &this->CMakeRole;
  local_40 = &this->InlineLiteral;
  local_48 = &this->InlineLink;
  lVar10 = 0;
  do {
    local_b0 = 0xffffffffffffffff;
    local_b8 = 0xffffffffffffffff;
    local_c0 = 0xffffffffffffffff;
    bVar4 = cmsys::RegularExpression::find
                      (local_38,local_68._M_dataplus._M_p + lVar10,&local_38->regmatch);
    if (bVar4) {
      local_b0 = (long)(this->CMakeRole).regmatch.startp[0] -
                 (long)(this->CMakeRole).regmatch.searchstring;
      puVar9 = &local_b0;
    }
    else {
      puVar9 = (ulong *)0x0;
    }
    bVar4 = cmsys::RegularExpression::find
                      (local_40,local_68._M_dataplus._M_p + lVar10,&local_40->regmatch);
    if (bVar4) {
      local_c0 = (long)(this->InlineLiteral).regmatch.startp[0] -
                 (long)(this->InlineLiteral).regmatch.searchstring;
      if ((puVar9 == (ulong *)0x0) || (local_c0 < *puVar9)) {
        puVar9 = &local_c0;
      }
    }
    bVar4 = cmsys::RegularExpression::find
                      (local_48,local_68._M_dataplus._M_p + lVar10,&local_48->regmatch);
    if (bVar4) {
      local_b8 = (long)(this->InlineLink).regmatch.startp[0] -
                 (long)(this->InlineLink).regmatch.searchstring;
      if ((puVar9 == (ulong *)0x0) || (local_b8 < *puVar9)) {
        puVar9 = &local_b8;
      }
    }
    if (puVar9 == &local_b0) {
      poVar6 = this->OS;
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_e0,local_d8);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      pcVar2 = (this->CMakeRole).regmatch.startp[3];
      if (pcVar2 == (char *)0x0) {
        local_d8 = 0;
        local_d0 = '\0';
        local_e0 = &local_d0;
      }
      else {
        local_e0 = &local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,pcVar2,(this->CMakeRole).regmatch.endp[3]);
      }
      pcVar2 = (this->CMakeRole).regmatch.startp[2];
      if (pcVar2 == (char *)0x0) {
        local_a8 = &local_98;
        local_a0 = 0;
        local_98 = 0;
      }
      else {
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,pcVar2,(this->CMakeRole).regmatch.endp[2]);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar5 == 0) {
        pcVar2 = (this->CMakeRole).regmatch.startp[5];
        if (pcVar2 == (char *)0x0) {
          local_88 = &local_78;
          local_80 = 0;
          local_78 = 0;
        }
        else {
          local_88 = &local_78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pcVar2,(this->CMakeRole).regmatch.endp[5]);
        }
        if (local_80 != 0) goto LAB_001c8909;
        lVar7 = std::__cxx11::string::find_first_of((char *)&local_e0,0x815f5b,0);
        bVar4 = lVar7 == -1;
      }
      else {
LAB_001c8909:
        bVar4 = false;
      }
      if ((iVar5 == 0) && (local_88 != &local_78)) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      if (bVar4) {
        std::__cxx11::string::append((char *)&local_e0);
      }
      poVar6 = this->OS;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"``",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_e0,local_d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"``",2);
      lVar7 = (long)(this->CMakeRole).regmatch.endp[0] -
              (long)(this->CMakeRole).regmatch.searchstring;
LAB_001c89aa:
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
LAB_001c89c1:
      lVar10 = lVar10 + lVar7;
      bVar4 = true;
    }
    else {
      if (puVar9 == &local_c0) {
        poVar6 = this->OS;
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_e0,local_d8);
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
        }
        pcVar2 = (this->InlineLiteral).regmatch.startp[1];
        if (pcVar2 == (char *)0x0) {
          local_d8 = 0;
          local_d0 = '\0';
          local_e0 = &local_d0;
        }
        else {
          local_e0 = &local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,pcVar2,(this->InlineLiteral).regmatch.endp[1]);
        }
        lVar7 = (long)(this->InlineLiteral).regmatch.endp[0] -
                (long)(this->InlineLiteral).regmatch.searchstring;
        poVar6 = this->OS;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"``",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_e0,local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"``",2);
        goto LAB_001c89aa;
      }
      if (puVar9 == &local_b8) {
        poVar6 = this->OS;
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_e0,local_d8);
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
        }
        pcVar2 = (this->InlineLink).regmatch.startp[1];
        if (pcVar2 == (char *)0x0) {
          local_d8 = 0;
          local_d0 = '\0';
          local_e0 = &local_d0;
        }
        else {
          local_e0 = &local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,pcVar2,(this->InlineLink).regmatch.endp[1]);
        }
        lVar7 = local_d8;
        pcVar2 = local_e0;
        if (local_d8 != 0) {
          lVar8 = 0;
          bVar4 = false;
          do {
            cVar1 = pcVar2[lVar8];
            if (bVar4) {
              local_a8 = (undefined1 *)CONCAT71(local_a8._1_7_,cVar1);
              std::__ostream_insert<char,std::char_traits<char>>(this->OS,(char *)&local_a8,1);
              bVar3 = false;
            }
            else {
              bVar3 = true;
              if (cVar1 != '\\') {
                local_a8 = (undefined1 *)CONCAT71(local_a8._1_7_,cVar1);
                std::__ostream_insert<char,std::char_traits<char>>(this->OS,(char *)&local_a8,1);
                bVar3 = bVar4;
              }
            }
            bVar4 = bVar3;
            lVar8 = lVar8 + 1;
          } while (lVar7 != lVar8);
        }
        lVar7 = (long)(this->InlineLink).regmatch.endp[0] -
                (long)(this->InlineLink).regmatch.searchstring;
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
        }
        goto LAB_001c89c1;
      }
      bVar4 = false;
    }
    if (!bVar4) {
      poVar6 = this->OS;
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_68);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_e0,local_d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if (this->OutputLinePending) {
    this->OS << "\n";
    this->OutputLinePending = false;
  }
  if (inlineMarkup) {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    for (;;) {
      std::string::size_type* first = nullptr;
      std::string::size_type role_start = std::string::npos;
      std::string::size_type link_start = std::string::npos;
      std::string::size_type lit_start = std::string::npos;
      if (this->CMakeRole.find(line.c_str() + pos)) {
        role_start = this->CMakeRole.start();
        first = &role_start;
      }
      if (this->InlineLiteral.find(line.c_str() + pos)) {
        lit_start = this->InlineLiteral.start();
        if (!first || lit_start < *first) {
          first = &lit_start;
        }
      }
      if (this->InlineLink.find(line.c_str() + pos)) {
        link_start = this->InlineLink.start();
        if (!first || link_start < *first) {
          first = &link_start;
        }
      }
      if (first == &role_start) {
        this->OS << line.substr(pos, role_start);
        std::string text = this->CMakeRole.match(3);
        // If a command reference has no explicit target and
        // no explicit "(...)" then add "()" to the text.
        if (this->CMakeRole.match(2) == "command" &&
            this->CMakeRole.match(5).empty() &&
            text.find_first_of("()") == std::string::npos) {
          text += "()";
        }
        this->OS << "``" << text << "``";
        pos += this->CMakeRole.end();
      } else if (first == &lit_start) {
        this->OS << line.substr(pos, lit_start);
        std::string text = this->InlineLiteral.match(1);
        pos += this->InlineLiteral.end();
        this->OS << "``" << text << "``";
      } else if (first == &link_start) {
        this->OS << line.substr(pos, link_start);
        std::string text = this->InlineLink.match(1);
        bool escaped = false;
        for (char c : text) {
          if (escaped) {
            escaped = false;
            this->OS << c;
          } else if (c == '\\') {
            escaped = true;
          } else {
            this->OS << c;
          }
        }
        pos += this->InlineLink.end();
      } else {
        break;
      }
    }
    this->OS << line.substr(pos) << "\n";
  } else {
    this->OS << line_in << "\n";
  }
}